

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O0

int envy_bios_parse_xpiodir(envy_bios *bios)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  envy_bios_xpiodir *peVar6;
  envy_bios_xpio *peVar7;
  envy_bios_xpio *xpio;
  int local_30;
  uint16_t eoff;
  int i;
  int wantrlen;
  int wanthlen;
  int err;
  envy_bios_xpiodir *xpiodir;
  envy_bios *bios_local;
  
  peVar6 = &(bios->gpio).xpiodir;
  if (peVar6->offset == 0) {
    bios_local._4_4_ = 0;
  }
  else {
    iVar2 = bios_u8(bios,(uint)peVar6->offset,&(bios->gpio).xpiodir.version);
    iVar3 = bios_u8(bios,peVar6->offset + 1,&(bios->gpio).xpiodir.hlen);
    iVar4 = bios_u8(bios,peVar6->offset + 2,&(bios->gpio).xpiodir.entriesnum);
    iVar5 = bios_u8(bios,peVar6->offset + 3,&(bios->gpio).xpiodir.rlen);
    envy_bios_block(bios,(uint)peVar6->offset,
                    (uint)(bios->gpio).xpiodir.hlen +
                    (uint)(bios->gpio).xpiodir.rlen * (uint)(bios->gpio).xpiodir.entriesnum,
                    "XPIODIR",-1);
    if (iVar5 == 0 && (iVar4 == 0 && (iVar3 == 0 && iVar2 == 0))) {
      if ((bios->gpio).xpiodir.version != ((bios->gpio).version & 0xf0)) {
        fprintf(_stderr,"XPIODIR version mismatch with GPIO\n");
      }
      uVar1 = (bios->gpio).xpiodir.version;
      if ((uVar1 == '0') || (uVar1 == '@')) {
        if ((bios->gpio).xpiodir.hlen < 4) {
          fprintf(_stderr,"XPIODIR table header too short [%d < %d]\n",
                  (ulong)(bios->gpio).xpiodir.hlen,4);
          bios_local._4_4_ = -0x16;
        }
        else if ((bios->gpio).xpiodir.rlen < 2) {
          fprintf(_stderr,"XPIODIR table record too short [%d < %d]\n",
                  (ulong)(bios->gpio).xpiodir.rlen,2);
          bios_local._4_4_ = -0x16;
        }
        else {
          if (4 < (bios->gpio).xpiodir.hlen) {
            fprintf(_stderr,"XPIODIR table header longer than expected [%d > %d]\n",
                    (ulong)(bios->gpio).xpiodir.hlen,4);
          }
          if (2 < (bios->gpio).xpiodir.rlen) {
            fprintf(_stderr,"XPIODIR table record longer than expected [%d > %d]\n",
                    (ulong)(bios->gpio).xpiodir.rlen,2);
          }
          peVar7 = (envy_bios_xpio *)calloc((ulong)(bios->gpio).xpiodir.entriesnum,0x18);
          (bios->gpio).xpiodir.entries = peVar7;
          if ((bios->gpio).xpiodir.entries == (envy_bios_xpio *)0x0) {
            bios_local._4_4_ = -0xc;
          }
          else {
            for (local_30 = 0; local_30 < (int)(uint)(bios->gpio).xpiodir.entriesnum;
                local_30 = local_30 + 1) {
              peVar7 = (bios->gpio).xpiodir.entries + local_30;
              iVar2 = bios_u16(bios,(uint)(ushort)(peVar6->offset +
                                                   (ushort)(bios->gpio).xpiodir.hlen +
                                                  (ushort)(bios->gpio).xpiodir.rlen *
                                                  (short)local_30),&peVar7->offset);
              if (iVar2 != 0) {
                return -0xe;
              }
              iVar2 = envy_bios_parse_xpio(bios,peVar7,local_30);
              if (iVar2 != 0) {
                fprintf(_stderr,"Failed to parse XPIO table at 0x%04x version %d.%d\n",
                        (ulong)peVar7->offset,(ulong)(uint)((int)(uint)peVar7->version >> 4),
                        (ulong)(peVar7->version & 0xf));
              }
            }
            (bios->gpio).xpiodir.valid = '\x01';
            bios_local._4_4_ = 0;
          }
        }
      }
      else {
        fprintf(_stderr,"Unknown XPIODIR table version %d.%d\n",
                (ulong)(uint)((int)(uint)(bios->gpio).xpiodir.version >> 4),
                (ulong)((bios->gpio).xpiodir.version & 0xf));
        bios_local._4_4_ = -0x16;
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_xpiodir (struct envy_bios *bios) {
	struct envy_bios_xpiodir *xpiodir = &bios->gpio.xpiodir;
	int err = 0;
	if (!xpiodir->offset)
		return 0;
	err |= bios_u8(bios, xpiodir->offset, &xpiodir->version);
	err |= bios_u8(bios, xpiodir->offset+1, &xpiodir->hlen);
	err |= bios_u8(bios, xpiodir->offset+2, &xpiodir->entriesnum);
	err |= bios_u8(bios, xpiodir->offset+3, &xpiodir->rlen);
	envy_bios_block(bios, xpiodir->offset, xpiodir->hlen + xpiodir->rlen * xpiodir->entriesnum, "XPIODIR", -1);
	if (err)
		return -EFAULT;
	int wanthlen = 0;
	int wantrlen = 0;
	if (xpiodir->version != (bios->gpio.version & 0xf0))
		ENVY_BIOS_WARN("XPIODIR version mismatch with GPIO\n");
	switch (xpiodir->version) {
		case 0x30:
		case 0x40:
			wanthlen = 4;
			wantrlen = 2;
			break;
		default:
			ENVY_BIOS_ERR("Unknown XPIODIR table version %d.%d\n", xpiodir->version >> 4, xpiodir->version & 0xf);
			return -EINVAL;
	}
	if (xpiodir->hlen < wanthlen) {
		ENVY_BIOS_ERR("XPIODIR table header too short [%d < %d]\n", xpiodir->hlen, wanthlen);
		return -EINVAL;
	}
	if (xpiodir->rlen < wantrlen) {
		ENVY_BIOS_ERR("XPIODIR table record too short [%d < %d]\n", xpiodir->rlen, wantrlen);
		return -EINVAL;
	}
	if (xpiodir->hlen > wanthlen) {
		ENVY_BIOS_WARN("XPIODIR table header longer than expected [%d > %d]\n", xpiodir->hlen, wanthlen);
	}
	if (xpiodir->rlen > wantrlen) {
		ENVY_BIOS_WARN("XPIODIR table record longer than expected [%d > %d]\n", xpiodir->rlen, wantrlen);
	}
	xpiodir->entries = calloc(xpiodir->entriesnum, sizeof *xpiodir->entries);
	if (!xpiodir->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < xpiodir->entriesnum; i++) {
		uint16_t eoff = xpiodir->offset + xpiodir->hlen + xpiodir->rlen * i;
		struct envy_bios_xpio *xpio = &xpiodir->entries[i];
		err |= bios_u16(bios, eoff, &xpio->offset);
		if (err)
			return -EFAULT;
		if (envy_bios_parse_xpio(bios, xpio, i))
			ENVY_BIOS_ERR("Failed to parse XPIO table at 0x%04x version %d.%d\n", xpio->offset, xpio->version >> 4, xpio->version & 0xf);
	}
	xpiodir->valid = 1;
	return 0;
}